

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osnetunix.h
# Opt level: O1

void __thiscall OSS_Watchdog::thread_main(OSS_Watchdog *this)

{
  long lVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  clock_t cVar5;
  time_t tVar6;
  undefined4 extraout_var_01;
  int iVar7;
  long lVar8;
  timespec tm;
  timespec local_40;
  
  iVar2 = (*(quit_evt->super_OS_Waitable)._vptr_OS_Waitable[2])(&quit_evt->super_OS_Waitable);
  iVar2 = OS_Event::evt_test((OS_Event *)CONCAT44(extraout_var,iVar2));
  if (iVar2 == 0) {
    do {
      iVar2 = (*(quit_evt->super_OS_Waitable)._vptr_OS_Waitable[2])(&quit_evt->super_OS_Waitable);
      OS_Waitable::figure_timeout(&local_40,10000);
      iVar2 = OS_Event::evt_wait((OS_Event *)CONCAT44(extraout_var_00,iVar2),&local_40);
      if (iVar2 == -1) {
        cVar5 = clock();
        this->stats[this->idx].cpu_time = cVar5 / 1000000;
        tVar6 = time((time_t *)0x0);
        this->stats[this->idx].wall_time = tVar6;
        iVar3 = this->cnt;
        this->cnt = iVar3 + 1;
        iVar2 = this->idx + 1;
        if (8 < this->idx) {
          iVar2 = 0;
        }
        this->idx = iVar2;
        if (5 < iVar3) {
          iVar7 = (-(uint)(0 < iVar2) | 9) + iVar2;
          iVar3 = iVar2 + 3;
          if (-1 < iVar2 + -7) {
            iVar3 = iVar2 + -7;
          }
          lVar1 = this->stats[iVar7].wall_time;
          lVar8 = lVar1 - OS_CoreSocket::last_incoming_time;
          if (0.4 <= (double)(this->stats[iVar7].cpu_time - this->stats[iVar3].cpu_time) /
                     (double)(lVar1 - this->stats[iVar3].wall_time)) {
            _Var4 = getpid();
            kill(_Var4,9);
          }
          if (0x168 < lVar8) {
            _Var4 = getpid();
            kill(_Var4,9);
          }
        }
      }
      iVar2 = (*(quit_evt->super_OS_Waitable)._vptr_OS_Waitable[2])(&quit_evt->super_OS_Waitable);
      iVar2 = OS_Event::evt_test((OS_Event *)CONCAT44(extraout_var_01,iVar2));
    } while (iVar2 == 0);
  }
  return;
}

Assistant:

virtual void thread_main()
    {
        oss_debug_log("watchdog thread started");
        
        /* loop until our 'quit' event has fired */
        while (!quit_evt->test())
        {
            /* wake up every 10 seconds, or when the 'quit' event fires */
            if (quit_evt->wait(10000) == OSWAIT_TIMEOUT)
            {
                /* 
                 *   That timed out, so it's time for another watchdog check.
                 *   First, update the timers. 
                 */
                stats[idx].cpu_time = clock() / CLOCKS_PER_SEC;
                stats[idx].wall_time = time(0);

                /* bump the statistics counters */
                ++cnt;
                if (++idx >= NSTATS)
                    idx = 0;

                /* 
                 *   If we've collected enough statistics, do our checks.  We
                 *   need at least 60 seconds of trailing data, and we wake
                 *   up every 10 seconds, so we need at least seven samples
                 *   (#0 is 0 seconds ago, #1 is 10 seconds ago, ... #6 is 60
                 *   seconds ago, hence we need 0-6 = 7 samples).
                 */
                if (cnt >= 7)
                {
                    /* get the last and the 60-seconds-ago stats */
                    const watchdog_stats *cur = get_stats(0);
                    const watchdog_stats *prv = get_stats(6);

                    /* calculate the percentage of CPU time */
                    double cpu_pct = ((double)(cur->cpu_time - prv->cpu_time))
                                     / (cur->wall_time - prv->wall_time);

                    /* calculate the time since the last network event */
                    time_t time_since_net =
                        cur->wall_time - OS_CoreSocket::last_incoming_time;

                    /*
                     *   Check for termination conditions:
                     *   
                     *   1.  If we've consumed 40% or higher CPU over the
                     *   last minute, we're probably stuck in a loop; we
                     *   might also be running an intentionally
                     *   compute-intensive program, which isn't a bug but is
                     *   an abuse of a shared server, so in either case kill
                     *   the program.  (We're not worried about short bursts
                     *   of high CPU usage, which is why we average over a
                     *   fairly long real-time period.)
                     *   
                     *   2.  If we haven't seen any incoming network activity
                     *   in 6 minutes, the program is probably idle and
                     *   should probably have noticed that and shut itself
                     *   down already, so it might have a bug in its internal
                     *   inactivity monitor.  It could also be intentionally
                     *   running as a continuous service, but that's abusive
                     *   on a shared server because it uses memory that's
                     *   meant to be shared.  In either case, shut it down.
                     */
                    if (cpu_pct >= 0.4)
                    {
                        oss_debug_log("watchdog terminating process due to "
                                      "high CPU usage (cpu_pct = %0.2ld%%)",
                                      cpu_pct);
                        kill(getpid(), 9);
                    }
                    if (time_since_net > 6*60)
                    {
                        oss_debug_log("watchdog terminating process due to "
                                      "network inactivity (time_since_net"
                                      " = %ld seconds)", (long)time_since_net);
                        kill(getpid(), 9);
                    }
                }
            }
        }
    }